

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

bool __thiscall
Inline::InlineCallBuiltInTarget
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlinerData,
          FunctionJITTimeInfo *inlineeData,FunctionJITTimeInfo *callFuncInfo,
          Instr *callTargetLdInstr,OpCode inlineOpCode,StackSym *symThis,uint recursiveInlineDepth,
          bool isCallInstanceFunction,Instr **returnInstr)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  StackSym *pSVar4;
  ByteCodeUsesInstr *this_00;
  undefined4 *puVar5;
  Instr *pIVar6;
  Instr *local_58;
  Instr *unused;
  FunctionJITTimeInfo *local_48;
  FunctionJITTimeInfo *local_40;
  bool local_35;
  OpCode local_34;
  bool local_32;
  undefined1 local_31;
  bool safeThis;
  bool isInlined;
  
  local_34 = callInstr->m_opcode;
  unused = callTargetLdInstr;
  local_48 = inlinerData;
  local_40 = inlineeData;
  pSVar4 = IR::Opnd::GetStackSym(callInstr->m_src1);
  bVar1 = callInstr->m_src1->field_0xb;
  local_35 = false;
  local_31 = TryOptimizeCallInstrWithFixedMethod
                       (this,callInstr,callFuncInfo,false,true,false,true,&local_35,false,0);
  if ((bool)local_31) {
    this_00 = IR::ByteCodeUsesInstr::New(callInstr);
    IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
              (this_00,(bool)((bVar1 & 8) >> 3),(pSVar4->super_Sym).m_id);
    IR::Instr::InsertBefore(callInstr,&this_00->super_Instr);
    callInstr->m_opcode = local_34;
    IR::Instr::ReplaceSrc1(callInstr,unused->m_dst);
    local_58 = (Instr *)0x0;
    AdjustArgoutsForCallTargetInlining(this,callInstr,&local_58,isCallInstanceFunction);
    local_32 = false;
    if (callInstr->m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar3) goto LAB_0055b6d8;
      *puVar5 = 0;
    }
    pIVar6 = InlineBuiltInFunction
                       (this,callInstr,local_40,inlineOpCode,local_48,symThis,&local_32,
                        (uint)*(ushort *)&callInstr[1]._vptr_Instr,recursiveInlineDepth,
                        &this_00->super_Instr);
    *returnInstr = pIVar6;
    if (local_32 == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xdd3,"(isInlined)","isInlined");
      if (!bVar3) {
LAB_0055b6d8:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  return (bool)local_31;
}

Assistant:

bool
Inline::InlineCallBuiltInTarget(IR::Instr *callInstr, const FunctionJITTimeInfo* inlinerData, const FunctionJITTimeInfo* inlineeData, const FunctionJITTimeInfo *callFuncInfo, IR::Instr * callTargetLdInstr, Js::OpCode inlineOpCode,
    const StackSym *symThis, uint recursiveInlineDepth, bool isCallInstanceFunction, IR::Instr ** returnInstr)
{
    Js::OpCode originalCallOpCode = callInstr->m_opcode;
    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();

    bool safeThis = false;
    if (!TryOptimizeCallInstrWithFixedMethod(callInstr, callFuncInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/, safeThis))
    {
        return false;
    }

    IR::ByteCodeUsesInstr * useCallTargetInstr = IR::ByteCodeUsesInstr::New(callInstr);
    useCallTargetInstr->SetRemovedOpndSymbol(originalCallTargetOpndJITOpt, originalCallTargetStackSym->m_id);
    callInstr->InsertBefore(useCallTargetInstr);

    callInstr->m_opcode = originalCallOpCode;
    callInstr->ReplaceSrc1(callTargetLdInstr->GetDst());

    IR::Instr * unused = nullptr;
    AdjustArgoutsForCallTargetInlining(callInstr, &unused, isCallInstanceFunction);

    bool isInlined = false;
    Js::ProfileId callSiteId = static_cast<Js::ProfileId>(callInstr->AsProfiledInstr()->u.profileId);
    *returnInstr = InlineBuiltInFunction(callInstr, inlineeData, inlineOpCode, inlinerData, symThis, &isInlined, callSiteId, recursiveInlineDepth, useCallTargetInstr);
    Assert(isInlined);

    return true;
}